

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

void agc_emax(agc_t *agc,mfcc_t **mfc,int32 n_frame)

{
  float *pfVar1;
  ulong uVar2;
  float fVar3;
  
  if (0 < n_frame) {
    uVar2 = 0;
    do {
      pfVar1 = (float *)mfc[uVar2];
      fVar3 = *pfVar1;
      if ((float)agc->obs_max <= fVar3 && fVar3 != (float)agc->obs_max) {
        agc->obs_max = (mfcc_t)fVar3;
        agc->obs_frame = 1;
        fVar3 = *pfVar1;
      }
      *pfVar1 = fVar3 - (float)agc->max;
      uVar2 = uVar2 + 1;
    } while ((uint)n_frame != uVar2);
  }
  return;
}

Assistant:

void
agc_emax(agc_t *agc, mfcc_t **mfc, int32 n_frame)
{
    int i;

    if (n_frame <= 0)
        return;
    for (i = 0; i < n_frame; ++i) {
        if (mfc[i][0] > agc->obs_max) {
            agc->obs_max = mfc[i][0];
            agc->obs_frame = 1;
        }
        mfc[i][0] -= agc->max;
    }
}